

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# symbol.cpp
# Opt level: O2

attr * __thiscall Env::findfunc(Env *this,string *s)

{
  iterator iVar1;
  Env *e;
  
  while( true ) {
    if (this == (Env *)0x0) {
      return (attr *)0x0;
    }
    iVar1 = std::
            _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_attr>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_attr>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_attr>_>_>
            ::find(&(this->func_table)._M_t,s);
    if ((_Rb_tree_header *)iVar1._M_node != &(this->func_table)._M_t._M_impl.super__Rb_tree_header)
    break;
    this = this->pre;
  }
  return (attr *)(iVar1._M_node + 2);
}

Assistant:

struct attr *Env::findfunc(const string &s) {
    map<string, attr>::iterator found;
    for (Env *e = this; e != NULL; e = e->pre) {
        found = e->func_table.find(s);
        if (found != e->func_table.end())
            return &(found->second);
    }
    return NULL;
}